

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::DelSomeItem(Map *this,short uid,int amount,Character *from)

{
  Character *pCVar1;
  bool bVar2;
  __shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  reference ppCVar5;
  Character *character_1;
  iterator __end4_1;
  iterator __begin4_1;
  list<Character_*,_std::allocator<Character_*>_> *__range4_1;
  Character *character;
  iterator __end4;
  iterator __begin4;
  list<Character_*,_std::allocator<Character_*>_> *__range4;
  undefined1 local_60 [8];
  PacketBuilder builder;
  _Self local_28;
  iterator it;
  Character *from_local;
  int amount_local;
  short uid_local;
  Map *this_local;
  
  if (-1 < amount) {
    it._M_node = (_List_node_base *)from;
    local_28._M_node =
         (_List_node_base *)
         std::
         begin<std::__cxx11::list<std::shared_ptr<Map_Item>,std::allocator<std::shared_ptr<Map_Item>>>>
                   (&this->items);
    while( true ) {
      builder.add_size =
           (size_t)std::
                   end<std::__cxx11::list<std::shared_ptr<Map_Item>,std::allocator<std::shared_ptr<Map_Item>>>>
                             (&this->items);
      bVar2 = std::operator!=(&local_28,(_Self *)&builder.add_size);
      if (!bVar2) break;
      p_Var3 = (__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&local_28);
      peVar4 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var3);
      if (peVar4->uid == uid) {
        p_Var3 = (__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&local_28);
        peVar4 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        if (peVar4->amount <= amount) {
          DelItem(this,(iterator)local_28._M_node,(Character *)it._M_node);
          return;
        }
        p_Var3 = (__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&local_28);
        peVar4 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        peVar4->amount = peVar4->amount - amount;
        PacketBuilder::PacketBuilder((PacketBuilder *)local_60,PACKET_ITEM,PACKET_REMOVE,2);
        p_Var3 = (__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&local_28);
        peVar4 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        PacketBuilder::AddShort((PacketBuilder *)local_60,(int)peVar4->uid);
        __end4 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin
                           (&this->characters);
        character = (Character *)
                    std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end
                              (&this->characters);
        while (bVar2 = std::operator!=(&__end4,(_Self *)&character), bVar2) {
          ppCVar5 = std::_List_iterator<Character_*>::operator*(&__end4);
          pCVar1 = *ppCVar5;
          if ((it._M_node == (_List_node_base *)0x0) || (pCVar1 != (Character *)it._M_node)) {
            p_Var3 = (__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&local_28);
            peVar4 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator*(p_Var3);
            bVar2 = Character::InRange(pCVar1,peVar4);
            if (bVar2) {
              Character::Send(pCVar1,(PacketBuilder *)local_60);
            }
          }
          std::_List_iterator<Character_*>::operator++(&__end4);
        }
        PacketBuilder::Reset((PacketBuilder *)local_60,9);
        PacketBuilder::SetID((PacketBuilder *)local_60,PACKET_ITEM,PACKET_ADD);
        p_Var3 = (__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&local_28);
        peVar4 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        PacketBuilder::AddShort((PacketBuilder *)local_60,(int)peVar4->id);
        p_Var3 = (__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&local_28);
        peVar4 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        PacketBuilder::AddShort((PacketBuilder *)local_60,(int)peVar4->uid);
        p_Var3 = (__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&local_28);
        peVar4 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        PacketBuilder::AddThree((PacketBuilder *)local_60,peVar4->amount);
        p_Var3 = (__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&local_28);
        peVar4 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        PacketBuilder::AddChar((PacketBuilder *)local_60,(uint)peVar4->x);
        p_Var3 = (__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&local_28);
        peVar4 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        PacketBuilder::AddChar((PacketBuilder *)local_60,(uint)peVar4->y);
        __end4_1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin
                             (&this->characters);
        character_1 = (Character *)
                      std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end
                                (&this->characters);
        while (bVar2 = std::operator!=(&__end4_1,(_Self *)&character_1), bVar2) {
          ppCVar5 = std::_List_iterator<Character_*>::operator*(&__end4_1);
          pCVar1 = *ppCVar5;
          p_Var3 = (__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&local_28);
          peVar4 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator*(p_Var3);
          bVar2 = Character::InRange(pCVar1,peVar4);
          if (bVar2) {
            Character::Send(pCVar1,(PacketBuilder *)local_60);
          }
          std::_List_iterator<Character_*>::operator++(&__end4_1);
        }
        PacketBuilder::~PacketBuilder((PacketBuilder *)local_60);
        return;
      }
      std::_List_iterator<std::shared_ptr<Map_Item>_>::operator++(&local_28);
    }
  }
  return;
}

Assistant:

void Map::DelSomeItem(short uid, int amount, Character *from)
{
	if (amount < 0)
		return;

	UTIL_IFOREACH(this->items, it)
	{
		if ((*it)->uid == uid)
		{
			if (amount < (*it)->amount)
			{
				(*it)->amount -= amount;

				PacketBuilder builder(PACKET_ITEM, PACKET_REMOVE, 2);
				builder.AddShort((*it)->uid);

				UTIL_FOREACH(this->characters, character)
				{
					if ((from && character == from) || !character->InRange(**it))
					{
						continue;
					}

					character->Send(builder);
				}

				builder.Reset(9);
				builder.SetID(PACKET_ITEM, PACKET_ADD);
				builder.AddShort((*it)->id);
				builder.AddShort((*it)->uid);
				builder.AddThree((*it)->amount);
				builder.AddChar((*it)->x);
				builder.AddChar((*it)->y);

				UTIL_FOREACH(this->characters, character)
				{
					if (!character->InRange(**it))
						continue;

					character->Send(builder);
				}
			}
			else
			{
				this->DelItem(it, from);
			}

			break;
		}
	}
}